

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O0

int mraa_find_i2c_bus_pci(char *pci_device,char *pci_id,char *adapter_name)

{
  mraa_boolean_t mVar1;
  mraa_result_t mVar2;
  int iVar3;
  bool bVar4;
  uint local_45c;
  char *pcStack_458;
  int ret;
  char *token;
  char *pcStack_448;
  char delim;
  char *orig_dup;
  char *dup;
  dirent **ppdStack_430;
  int n;
  dirent **namelist;
  char path [1024];
  char *adapter_name_local;
  char *pci_id_local;
  char *pci_device_local;
  
  path._1016_8_ = adapter_name;
  snprintf((char *)&namelist,0x3ff,"/sys/devices/pci%s/%s/%s/",pci_device,pci_id,adapter_name);
  mVar1 = mraa_file_exist((char *)&namelist);
  if (mVar1 != 0) {
    dup._4_4_ = scandir((char *)&namelist,&stack0xfffffffffffffbd0,(__selector *)0x0,alphasort);
    if (dup._4_4_ < 0) {
      syslog(3,"Failed to get information on i2c");
      return -1;
    }
    while (iVar3 = dup._4_4_ + -1, bVar4 = dup._4_4_ != 0, dup._4_4_ = iVar3, bVar4) {
      pcStack_448 = strdup(ppdStack_430[iVar3]->d_name);
      orig_dup = pcStack_448;
      if (pcStack_448 == (char *)0x0) {
        syslog(3,"Ran out of memory!");
        break;
      }
      token._7_1_ = 0x2d;
      pcStack_458 = strsep(&orig_dup,(char *)((long)&token + 7));
      if ((pcStack_458 != (char *)0x0) && (iVar3 = strncmp("i2c",pcStack_458,3), iVar3 == 0)) {
        pcStack_458 = strsep(&orig_dup,(char *)((long)&token + 7));
        if (pcStack_458 != (char *)0x0) {
          local_45c = 0xffffffff;
          mVar2 = mraa_atoi(pcStack_458,(int *)&local_45c);
          if (mVar2 == MRAA_SUCCESS) {
            free(pcStack_448);
            free(ppdStack_430[dup._4_4_]);
            free(ppdStack_430);
            syslog(5,"Adding i2c bus found on i2c-%d on adapter %s",(ulong)local_45c,path._1016_8_);
            return local_45c;
          }
          free(pcStack_448);
          free(ppdStack_430[dup._4_4_]);
          free(ppdStack_430);
          return -1;
        }
        pcStack_458 = (char *)0x0;
      }
      free(pcStack_448);
      free(ppdStack_430[dup._4_4_]);
    }
    free(ppdStack_430);
  }
  return -1;
}

Assistant:

int
mraa_find_i2c_bus_pci(const char* pci_device, const char* pci_id, const char* adapter_name)
{
    /**
     * For example we'd get something like:
     * pci0000:00/0000:00:16.3/i2c_desiignware.3
     */
    char path[1024];
    snprintf(path, 1024 - 1, "/sys/devices/pci%s/%s/%s/", pci_device, pci_id, adapter_name);
    if (mraa_file_exist(path)) {
        struct dirent** namelist;
        int n;
        n = scandir(path, &namelist, NULL, alphasort);
        if (n < 0) {
            syslog(LOG_ERR, "Failed to get information on i2c");
            return -1;
        } else {
            while (n--) {
                char* dup = strdup(namelist[n]->d_name);
                char* orig_dup = dup;
                if (dup == NULL) {
                    syslog(LOG_ERR, "Ran out of memory!");
                    break;
                }
                const char delim = '-';
                char* token;
                token = strsep(&dup, &delim);
                if (token != NULL) {
                    if (strncmp("i2c", token, 3) == 0) {
                        token = strsep(&dup, &delim);
                        if (token != NULL) {
                            int ret = -1;
                            if (mraa_atoi(token, &ret) == MRAA_SUCCESS) {
                                free(orig_dup);
                                free(namelist[n]);
                                free(namelist);
                                syslog(LOG_NOTICE, "Adding i2c bus found on i2c-%d on adapter %s", ret, adapter_name);
                                return ret;
                            }
                            free(orig_dup);
                            free(namelist[n]);
                            free(namelist);
                            return -1;
                        }
                    }
                }
                free(orig_dup);
                free(namelist[n]);
            }
            free(namelist);
        }
    }
    return -1;
}